

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void __thiscall cmSystemTools::EnvDiff::PutEnv(EnvDiff *this,string *env)

{
  optional<std::__cxx11::string> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string name;
  size_type eq_loc;
  string *env_local;
  EnvDiff *this_local;
  
  name.field_2._8_8_ = std::__cxx11::string::find((char)env,0x3d);
  if (name.field_2._8_8_ == -1) {
    UnPutEnv(this,env);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)env);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)env);
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,(key_type *)local_40);
    std::optional<std::__cxx11::string>::operator=(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmSystemTools::EnvDiff::PutEnv(const std::string& env)
{
  auto const eq_loc = env.find('=');
  if (eq_loc != std::string::npos) {
    std::string name = env.substr(0, eq_loc);
    diff[name] = env.substr(eq_loc + 1);
  } else {
    this->UnPutEnv(env);
  }
}